

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_geometry.cpp
# Opt level: O2

bool __thiscall
ON_Geometry::GetBoundingBox(ON_Geometry *this,ON_3dPoint *boxmin,ON_3dPoint *boxmax,bool bGrowBox)

{
  uint uVar1;
  int iVar2;
  ON_3dPoint *__s;
  ON_3dPoint *pOVar3;
  undefined8 uVar4;
  double dVar5;
  long lStack_60;
  ON_Workspace ws;
  
  ON_Workspace::ON_Workspace(&ws);
  uVar1 = (*(this->super_ON_Object)._vptr_ON_Object[0x18])(this);
  if ((int)uVar1 < 4) {
    pOVar3 = boxmax;
    __s = boxmin;
    if (bGrowBox) {
LAB_004ab2e0:
      if (((boxmax->x <= boxmin->x && boxmin->x != boxmax->x) ||
          (boxmax->y <= boxmin->y && boxmin->y != boxmax->y)) ||
         (uVar4 = 1, boxmax->z <= boxmin->z && boxmin->z != boxmax->z)) {
        uVar4 = 0;
      }
    }
    else {
      uVar4 = 0;
    }
  }
  else {
    __s = (ON_3dPoint *)ON_Workspace::GetDoubleMemory(&ws,(ulong)(uVar1 * 2));
    pOVar3 = (ON_3dPoint *)(&__s->x + uVar1);
    uVar4 = 0;
    memset(__s,0,(ulong)(uVar1 * 2) << 3);
    if (bGrowBox) {
      __s->x = boxmin->x;
      __s->y = boxmin->y;
      __s->y = boxmin->z;
      pOVar3->x = boxmax->x;
      pOVar3->y = boxmax->y;
      pOVar3->y = boxmax->z;
      goto LAB_004ab2e0;
    }
  }
  iVar2 = (*(this->super_ON_Object)._vptr_ON_Object[0x19])(this,__s,pOVar3,uVar4);
  if ((int)uVar1 < 4) {
    if (uVar1 == 3) goto LAB_004ab398;
    boxmin->z = 0.0;
    boxmax->z = 0.0;
    if (1 < (int)uVar1) goto LAB_004ab398;
    boxmin->y = 0.0;
    dVar5 = 0.0;
    lStack_60 = 8;
  }
  else {
    boxmin->x = __s->x;
    boxmin->y = __s->y;
    boxmin->z = __s->z;
    boxmax->x = pOVar3->x;
    boxmax->y = pOVar3->y;
    dVar5 = pOVar3->z;
    lStack_60 = 0x10;
  }
  *(double *)((long)&boxmax->x + lStack_60) = dVar5;
LAB_004ab398:
  ON_Workspace::~ON_Workspace(&ws);
  return SUB41(iVar2,0);
}

Assistant:

bool 
ON_Geometry::GetBoundingBox( // returns true if successful
  ON_3dPoint& boxmin,
  ON_3dPoint& boxmax,
  bool bGrowBox
  ) const
{
  ON_Workspace ws;
  const int dim = Dimension();
  double *bmin, *bmax;
  if ( dim <= 3 ) {
    bmin = &boxmin.x;
    bmax = &boxmax.x;
  }
  else {
    bmin = ws.GetDoubleMemory(dim*2);
    bmax = bmin+dim;
    memset( bmin, 0, 2*dim*sizeof(*bmin) );
    if ( bGrowBox ) {
      bmin[0] = boxmin.x; bmin[1] = boxmin.y; bmin[1] = boxmin.z;
      bmax[0] = boxmax.x; bmax[1] = boxmax.y; bmax[1] = boxmax.z;
    }
  }
	// Treat invalid box on input as empty
	bool invalid=false;	//input box invalid=empty
	if(bGrowBox)
		invalid =  boxmin.x>boxmax.x || boxmin.y>boxmax.y|| boxmin.z>boxmax.z;
	if(bGrowBox && invalid)
		bGrowBox=false;

  const bool rc = (0 != GetBBox( bmin, bmax, bGrowBox ));
  if ( dim > 3 ) {
    boxmin.x = bmin[0]; boxmin.y = bmin[1]; boxmin.z = bmin[2];
    boxmax.x = bmax[0]; boxmax.y = bmax[1]; boxmax.z = bmax[2];
  }
  else if ( dim <= 2 ) {
    boxmin.z = 0.0;
    boxmax.z = 0.0;
    if ( dim <= 1 ) {
      boxmin.y = 0.0;
      boxmax.y = 0.0;
    }
  }
  return rc;
}